

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_replace_item_via_pointer_should_replace_items(void)

{
  long lVar1;
  cJSON_bool cVar2;
  cJSON *item;
  cJSON *item_00;
  cJSON *item_01;
  cJSON *array_00;
  long in_FS_OFFSET;
  cJSON *array;
  cJSON *end;
  cJSON *middle;
  cJSON *beginning;
  cJSON replacements [3];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  item = cJSON_CreateNull();
  if (item == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x123);
  }
  item_00 = cJSON_CreateNull();
  if (item_00 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x125);
  }
  item_01 = cJSON_CreateNull();
  if (item_01 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x127);
  }
  array_00 = cJSON_CreateArray();
  if (array_00 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x12a);
  }
  cJSON_AddItemToArray(array_00,item);
  cJSON_AddItemToArray(array_00,item_00);
  cJSON_AddItemToArray(array_00,item_01);
  memset(&beginning,0,0xc0);
  cVar2 = cJSON_ReplaceItemViaPointer(array_00,item,(cJSON *)&beginning);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x134);
  }
  if (replacements[0].next != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x135);
  }
  if (beginning != item_00) {
    UnityFail(" Expected TRUE Was FALSE",0x136);
  }
  if (item_00->prev != (cJSON *)&beginning) {
    UnityFail(" Expected TRUE Was FALSE",0x137);
  }
  if (array_00->child != (cJSON *)&beginning) {
    UnityFail(" Expected TRUE Was FALSE",0x138);
  }
  cVar2 = cJSON_ReplaceItemViaPointer(array_00,item_00,(cJSON *)&replacements[0].string);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x13b);
  }
  if (replacements[1].next != (cJSON *)&beginning) {
    UnityFail(" Expected TRUE Was FALSE",0x13c);
  }
  if ((cJSON *)replacements[0].string != item_01) {
    UnityFail(" Expected TRUE Was FALSE",0x13d);
  }
  if (item_01->prev != (cJSON *)&replacements[0].string) {
    UnityFail(" Expected TRUE Was FALSE",0x13e);
  }
  cVar2 = cJSON_ReplaceItemViaPointer(array_00,item_01,(cJSON *)&replacements[1].string);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x141);
  }
  if (replacements[2].next != (cJSON *)&replacements[0].string) {
    UnityFail(" Expected TRUE Was FALSE",0x142);
  }
  if (replacements[1].string != (char *)0x0) {
    UnityFail(" Expected NULL",0x143);
  }
  if ((char **)replacements[0].string != &replacements[1].string) {
    UnityFail(" Expected TRUE Was FALSE",0x144);
  }
  cJSON_free(array_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cjson_replace_item_via_pointer_should_replace_items(void)
{
    cJSON replacements[3];
    cJSON *beginning = NULL;
    cJSON *middle = NULL;
    cJSON *end = NULL;
    cJSON *array = NULL;

    beginning = cJSON_CreateNull();
    TEST_ASSERT_NOT_NULL(beginning);
    middle = cJSON_CreateNull();
    TEST_ASSERT_NOT_NULL(middle);
    end = cJSON_CreateNull();
    TEST_ASSERT_NOT_NULL(end);

    array = cJSON_CreateArray();
    TEST_ASSERT_NOT_NULL(array);

    cJSON_AddItemToArray(array, beginning);
    cJSON_AddItemToArray(array, middle);
    cJSON_AddItemToArray(array, end);


    memset(replacements, '\0', sizeof(replacements));

    /* replace beginning */
    TEST_ASSERT_TRUE(cJSON_ReplaceItemViaPointer(array, beginning, &(replacements[0])));
    TEST_ASSERT_NULL(replacements[0].prev);
    TEST_ASSERT_TRUE(replacements[0].next == middle);
    TEST_ASSERT_TRUE(middle->prev == &(replacements[0]));
    TEST_ASSERT_TRUE(array->child == &(replacements[0]));

    /* replace middle */
    TEST_ASSERT_TRUE(cJSON_ReplaceItemViaPointer(array, middle, &(replacements[1])));
    TEST_ASSERT_TRUE(replacements[1].prev == &(replacements[0]));
    TEST_ASSERT_TRUE(replacements[1].next == end);
    TEST_ASSERT_TRUE(end->prev == &(replacements[1]));

    /* replace end */
    TEST_ASSERT_TRUE(cJSON_ReplaceItemViaPointer(array, end, &(replacements[2])));
    TEST_ASSERT_TRUE(replacements[2].prev == &(replacements[1]));
    TEST_ASSERT_NULL(replacements[2].next);
    TEST_ASSERT_TRUE(replacements[1].next == &(replacements[2]));

    cJSON_free(array);
}